

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O0

void __thiscall MediaManager::MediaManager(MediaManager *this,DataContainer *container)

{
  DataContainer *container_local;
  MediaManager *this_local;
  
  ITypeManager::ITypeManager(&this->super_ITypeManager);
  (this->super_ITypeManager)._vptr_ITypeManager = (_func_int **)&PTR_GetTypeFromFile_0022d9b8;
  this->container_ = container;
  std::vector<IMedia_*,_std::allocator<IMedia_*>_>::vector(&this->media_list_);
  Init(this);
  return;
}

Assistant:

MediaManager::MediaManager(DataContainer* container): container_(container)
{
   Init();
}